

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O3

CURLcode Curl_is_connected(connectdata *conn,int sockindex,_Bool *connected)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  bool bVar4;
  _Bool _Var5;
  uint uVar6;
  CURLcode CVar7;
  CURLcode CVar8;
  long lVar9;
  int *piVar10;
  char *pcVar11;
  ulong uVar12;
  Curl_easy *pCVar13;
  uint uVar14;
  long lVar15;
  int error;
  char ipaddress [46];
  int local_a8;
  int local_a4;
  CURLcode local_a0;
  uint local_9c;
  timeval local_98;
  _Bool *local_88;
  long local_80;
  Curl_easy *local_78;
  ulong local_70;
  char local_68 [56];
  
  pCVar13 = conn->data;
  local_a8 = 0;
  *connected = false;
  if ((conn->bits).tcpconnect[sockindex] == true) {
    *connected = true;
LAB_00131668:
    CVar7 = CURLE_OK;
  }
  else {
    local_a4 = sockindex;
    local_98 = curlx_tvnow();
    local_70 = Curl_timeleft(pCVar13,&local_98,true);
    if ((long)local_70 < 0) {
      Curl_failf(pCVar13,"Connection time-out");
      CVar7 = CURLE_OPERATION_TIMEDOUT;
    }
    else {
      lVar15 = 0;
      local_a0 = CURLE_OK;
      local_88 = connected;
      local_80 = (long)sockindex;
      local_78 = pCVar13;
      bVar4 = true;
      do {
        bVar2 = bVar4;
        if (conn->tempsock[lVar15] != -1) {
          uVar14 = (uint)lVar15 ^ 1;
          uVar6 = Curl_socket_check(-1,-1,conn->tempsock[lVar15],0);
          if (uVar6 == 2) {
LAB_00131790:
            _Var5 = verifyconnect(conn->tempsock[lVar15],&local_a8);
            lVar9 = local_80;
            if (_Var5) {
              conn->sock[local_80] = conn->tempsock[lVar15];
              conn->ip_addr = conn->tempaddr[lVar15];
              conn->tempsock[lVar15] = -1;
              if (conn->tempsock[uVar14] != -1) {
                Curl_closesocket(conn,conn->tempsock[uVar14]);
                conn->tempsock[uVar14] = -1;
              }
              CVar7 = Curl_connected_proxy(conn,local_a4);
              if (CVar7 != CURLE_OK) {
                return CVar7;
              }
              (conn->bits).tcpconnect[lVar9] = true;
              *local_88 = true;
              if (local_a4 == 0) {
                Curl_pgrsTime(pCVar13,TIMER_CONNECT);
              }
              Curl_updateconninfo(conn,conn->sock[lVar9]);
              Curl_verboseconnect(conn);
              goto LAB_00131668;
            }
            Curl_infof(pCVar13,"Connection failed\n");
          }
          else if (uVar6 == 0) {
            local_a8 = 0;
            lVar9 = curlx_tvdiff(local_98,conn->connecttime);
            if (conn->timeoutms_per_addr <= lVar9) {
              Curl_infof(pCVar13,"After %ldms connect time, move on!\n");
              local_a8 = 0x6e;
            }
            if (((bVar2) && (conn->tempaddr[1] == (Curl_addrinfo *)0x0)) &&
               (lVar9 = curlx_tvdiff(local_98,conn->connecttime), 199 < lVar9)) {
              trynextip(conn,local_a4,1);
            }
          }
          else {
            if ((conn->bits).tcp_fastopen == true) goto LAB_00131790;
            if ((uVar6 & 4) != 0) {
              verifyconnect(conn->tempsock[lVar15],&local_a8);
            }
          }
          iVar3 = local_a8;
          if (local_a8 != 0) {
            (pCVar13->state).os_errno = local_a8;
            piVar10 = __errno_location();
            *piVar10 = iVar3;
            if (conn->tempaddr[lVar15] != (Curl_addrinfo *)0x0) {
              local_9c = uVar14;
              Curl_printable_address(conn->tempaddr[lVar15],local_68,0x2e);
              lVar9 = conn->port;
              pcVar11 = Curl_strerror(conn,local_a8);
              Curl_infof(pCVar13,"connect to %s port %ld failed: %s\n",local_68,lVar9,pcVar11);
              conn->timeoutms_per_addr =
                   local_70 >> (conn->tempaddr[lVar15]->ai_next != (Curl_addrinfo *)0x0);
              CVar7 = trynextip(conn,local_a4,(uint)lVar15);
              pCVar13 = local_78;
              if ((CVar7 != CURLE_COULDNT_CONNECT) || (conn->tempsock[local_9c] == -1)) {
                local_a0 = CVar7;
              }
            }
          }
        }
        lVar15 = 1;
        bVar4 = false;
      } while (bVar2);
      CVar7 = CURLE_OK;
      if ((local_a0 != CURLE_OK) &&
         ((CVar8 = local_a0, conn->tempaddr[1] != (Curl_addrinfo *)0x0 ||
          (CVar8 = trynextip(conn,local_a4,1), CVar8 != CURLE_OK)))) {
        uVar12 = 0x100;
        if ((conn->bits).proxy == false) {
          uVar12 = (ulong)(conn->bits).conn_to_host << 5 | 0xc0;
        }
        uVar1 = *(undefined8 *)((conn->chunk).hexbuffer + (uVar12 - 8));
        lVar15 = conn->port;
        pcVar11 = Curl_strerror(conn,local_a8);
        Curl_failf(pCVar13,"Failed to connect to %s port %ld: %s",uVar1,lVar15,pcVar11);
        CVar7 = CVar8;
      }
    }
  }
  return CVar7;
}

Assistant:

CURLcode Curl_is_connected(struct connectdata *conn,
                           int sockindex,
                           bool *connected)
{
  struct Curl_easy *data = conn->data;
  CURLcode result = CURLE_OK;
  long allow;
  int error = 0;
  struct timeval now;
  int rc;
  int i;

  DEBUGASSERT(sockindex >= FIRSTSOCKET && sockindex <= SECONDARYSOCKET);

  *connected = FALSE; /* a very negative world view is best */

  if(conn->bits.tcpconnect[sockindex]) {
    /* we are connected already! */
    *connected = TRUE;
    return CURLE_OK;
  }

  now = Curl_tvnow();

  /* figure out how long time we have left to connect */
  allow = Curl_timeleft(data, &now, TRUE);

  if(allow < 0) {
    /* time-out, bail out, go home */
    failf(data, "Connection time-out");
    return CURLE_OPERATION_TIMEDOUT;
  }

  for(i=0; i<2; i++) {
    const int other = i ^ 1;
    if(conn->tempsock[i] == CURL_SOCKET_BAD)
      continue;

#ifdef mpeix
    /* Call this function once now, and ignore the results. We do this to
       "clear" the error state on the socket so that we can later read it
       reliably. This is reported necessary on the MPE/iX operating system. */
    (void)verifyconnect(conn->tempsock[i], NULL);
#endif

    /* check socket for connect */
    rc = Curl_socket_ready(CURL_SOCKET_BAD, conn->tempsock[i], 0);

    if(rc == 0) { /* no connection yet */
      error = 0;
      if(curlx_tvdiff(now, conn->connecttime) >= conn->timeoutms_per_addr) {
        infof(data, "After %ldms connect time, move on!\n",
              conn->timeoutms_per_addr);
        error = ETIMEDOUT;
      }

      /* should we try another protocol family? */
      if(i == 0 && conn->tempaddr[1] == NULL &&
         curlx_tvdiff(now, conn->connecttime) >= HAPPY_EYEBALLS_TIMEOUT) {
        trynextip(conn, sockindex, 1);
      }
    }
    else if(rc == CURL_CSELECT_OUT || conn->bits.tcp_fastopen) {
      if(verifyconnect(conn->tempsock[i], &error)) {
        /* we are connected with TCP, awesome! */

        /* use this socket from now on */
        conn->sock[sockindex] = conn->tempsock[i];
        conn->ip_addr = conn->tempaddr[i];
        conn->tempsock[i] = CURL_SOCKET_BAD;

        /* close the other socket, if open */
        if(conn->tempsock[other] != CURL_SOCKET_BAD) {
          Curl_closesocket(conn, conn->tempsock[other]);
          conn->tempsock[other] = CURL_SOCKET_BAD;
        }

        /* see if we need to do any proxy magic first once we connected */
        result = Curl_connected_proxy(conn, sockindex);
        if(result)
          return result;

        conn->bits.tcpconnect[sockindex] = TRUE;

        *connected = TRUE;
        if(sockindex == FIRSTSOCKET)
          Curl_pgrsTime(data, TIMER_CONNECT); /* connect done */
        Curl_updateconninfo(conn, conn->sock[sockindex]);
        Curl_verboseconnect(conn);

        return CURLE_OK;
      }
      else
        infof(data, "Connection failed\n");
    }
    else if(rc & CURL_CSELECT_ERR)
      (void)verifyconnect(conn->tempsock[i], &error);

    /*
     * The connection failed here, we should attempt to connect to the "next
     * address" for the given host. But first remember the latest error.
     */
    if(error) {
      data->state.os_errno = error;
      SET_SOCKERRNO(error);
      if(conn->tempaddr[i]) {
        CURLcode status;
        char ipaddress[MAX_IPADR_LEN];
        Curl_printable_address(conn->tempaddr[i], ipaddress, MAX_IPADR_LEN);
        infof(data, "connect to %s port %ld failed: %s\n",
              ipaddress, conn->port, Curl_strerror(conn, error));

        conn->timeoutms_per_addr = conn->tempaddr[i]->ai_next == NULL ?
                                   allow : allow / 2;

        status = trynextip(conn, sockindex, i);
        if(status != CURLE_COULDNT_CONNECT
            || conn->tempsock[other] == CURL_SOCKET_BAD)
          /* the last attempt failed and no other sockets remain open */
          result = status;
      }
    }
  }

  if(result) {
    /* no more addresses to try */

    const char* hostname;

    /* if the first address family runs out of addresses to try before
       the happy eyeball timeout, go ahead and try the next family now */
    if(conn->tempaddr[1] == NULL) {
      result = trynextip(conn, sockindex, 1);
      if(!result)
        return result;
    }

    if(conn->bits.proxy)
      hostname = conn->proxy.name;
    else if(conn->bits.conn_to_host)
      hostname = conn->conn_to_host.name;
    else
      hostname = conn->host.name;

    failf(data, "Failed to connect to %s port %ld: %s",
        hostname, conn->port, Curl_strerror(conn, error));
  }

  return result;
}